

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

void * Acb_VerilogSimpleParse(Vec_Int_t *vBuffer,Abc_Nam_t *pNames)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  Vec_Int_t *__ptr;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  int *pDesign;
  undefined1 *puVar11;
  undefined4 *puVar12;
  void *pvVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  Vec_Int_t *p;
  Vec_Int_t *pVVar18;
  uint uVar19;
  long lVar21;
  int Output;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int local_6c;
  Vec_Int_t *pInputs;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar22;
  int local_3c;
  char *local_38;
  uint uVar20;
  
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nCap = 100;
  __ptr->nSize = 0;
  piVar6 = (int *)malloc(400);
  __ptr->pArray = piVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar8->pArray = piVar6;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar9->pArray = piVar6;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar10->pArray = piVar6;
  iVar15 = local_6c;
  if (0 < vBuffer->nSize) {
    if (*vBuffer->pArray != 1) {
      __assert_fail("Vec_IntEntry(vBuffer, 0) == ACB_MODULE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                    ,0xda,"void *Acb_VerilogSimpleParse(Vec_Int_t *, Abc_Nam_t *)");
    }
    iVar16 = vBuffer->nSize;
    pInputs = pVVar8;
    p_00 = pVVar9;
    if (2 < iVar16) {
      uVar19 = 2;
      p = (Vec_Int_t *)0x0;
      pVVar22 = pVVar10;
      do {
        iVar15 = local_6c;
        if ((int)uVar19 < 0) goto LAB_0036be32;
        iVar15 = vBuffer->pArray[uVar19];
        uVar20 = uVar19;
        local_6c = iVar15;
        pVVar10 = pVVar22;
        if ((p == (Vec_Int_t *)0x0) && (0xd < iVar15)) {
          pVVar18 = (Vec_Int_t *)0x0;
        }
        else {
          pVVar18 = pVVar7;
          switch(iVar15) {
          case 2:
            goto switchD_0036b77f_caseD_2;
          case 3:
            pVVar18 = __ptr;
            break;
          case 4:
            break;
          case 5:
            pVVar18 = pVVar8;
            break;
          default:
            if (iVar15 - 6U < 8) {
              uVar1 = uVar19 + 1;
              if (iVar16 <= (int)uVar1) goto LAB_0036be32;
              local_38 = Abc_NamStr(pNames,vBuffer->pArray[uVar1]);
              pVVar9 = p_00;
              Vec_IntPush(p_00,iVar15);
              pVVar8 = pInputs;
              pVVar10 = pVVar22;
              Vec_IntPush(p_00,pVVar22->nSize);
              pVVar18 = pVVar22;
              pInputs = pVVar8;
              p_00 = pVVar9;
              if ((((local_38[1] == 'z') && (pVVar18 = pVVar10, local_38[2] == '_')) &&
                  (local_38[3] == 'g')) && (uVar20 = uVar1, local_38[4] != '_')) {
                uVar20 = uVar19;
              }
            }
            else {
              pVVar8 = pInputs;
              Vec_IntPush(p,iVar15);
              pVVar18 = p;
              pInputs = pVVar8;
              pVVar10 = pVVar22;
            }
          }
        }
        uVar19 = uVar20 + 1;
        iVar16 = vBuffer->nSize;
        p = pVVar18;
        pVVar22 = pVVar10;
      } while ((int)uVar19 < iVar16);
    }
switchD_0036b77f_caseD_2:
    Vec_IntPush(pVVar9,-1);
    Vec_IntPush(pVVar9,pVVar10->nSize);
    iVar15 = local_6c;
    if (1 < vBuffer->nSize) {
      piVar6 = vBuffer->pArray;
      iVar15 = piVar6[1];
      pDesign = (int *)malloc(0x18);
      pDesign[0] = 0;
      pDesign[1] = 0x10;
      puVar11 = (undefined1 *)malloc(0x10);
      *(undefined1 **)(pDesign + 2) = puVar11;
      puVar12 = (undefined4 *)malloc(0x100);
      *(undefined4 **)(pDesign + 4) = puVar12;
      *puVar11 = 1;
      *pDesign = 1;
      *puVar12 = 0;
      puVar11[1] = 7;
      *pDesign = 2;
      puVar12[1] = iVar15;
      *puVar12 = 2;
      if (iVar15 == 0) {
        __assert_fail("Name",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                      ,0x20d,"void *Ndr_Create(int)");
      }
      iVar15 = piVar6[1];
      *(undefined1 *)(*(long *)(pDesign + 2) + 2) = 2;
      iVar16 = *pDesign;
      *pDesign = iVar16 + 1;
      *(undefined4 *)(*(long *)(pDesign + 4) + (long)iVar16 * 4) = 0;
      *(undefined1 *)(*(long *)(pDesign + 2) + 1 + (long)iVar16) = 7;
      piVar6 = *(int **)(pDesign + 4);
      iVar16 = *pDesign;
      *pDesign = iVar16 + 1;
      piVar6[iVar16] = iVar15;
      pbVar4 = *(byte **)(pDesign + 2);
      if (pbVar4[2] == 0) {
LAB_0036be99:
        __assert_fail("p->pHead[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                      ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
      }
      if (pbVar4[2] < 4) {
        piVar6[2] = piVar6[2] + iVar16 + -1;
        if (*pbVar4 == 0) goto LAB_0036be99;
        if (*pbVar4 < 4) {
          iVar15 = *pDesign + -2 + *piVar6;
          *piVar6 = iVar15;
          if (iVar15 != *pDesign) {
            __assert_fail("(int)p->pBody[0] == p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                          ,0x21c,"int Ndr_AddModule(void *, int)");
          }
          iVar15 = *pDesign + __ptr->nSize;
          pVVar8 = pVVar7;
          if (pDesign[1] < iVar15) {
            iVar16 = pDesign[1] * 2;
            if (iVar16 <= iVar15) {
              iVar16 = iVar15;
            }
            pDesign[1] = iVar16;
            pvVar13 = realloc(pbVar4,(long)iVar16);
            *(void **)(pDesign + 2) = pvVar13;
            pvVar13 = realloc(*(void **)(pDesign + 4),(long)(iVar16 << 2));
            *(void **)(pDesign + 4) = pvVar13;
          }
          iVar15 = __ptr->nSize;
          if (0 < iVar15) {
            iVar16 = *pDesign;
            lVar21 = *(long *)(pDesign + 2);
            lVar5 = *(long *)(pDesign + 4);
            lVar17 = 0;
            do {
              local_6c = __ptr->pArray[lVar17];
              *(undefined1 *)(lVar21 + iVar16 + lVar17) = 4;
              *(int *)((long)iVar16 * 4 + lVar5 + lVar17 * 4) = local_6c;
              lVar17 = lVar17 + 1;
              iVar15 = __ptr->nSize;
            } while (lVar17 < iVar15);
            *pDesign = iVar16 + (int)lVar17;
          }
          pbVar4 = *(byte **)(pDesign + 2);
          if (pbVar4[2] == 0) goto LAB_0036be99;
          if (pbVar4[2] < 4) {
            piVar6 = *(int **)(pDesign + 4);
            piVar6[2] = piVar6[2] + iVar15;
            if (*pbVar4 == 0) goto LAB_0036be99;
            if (*pbVar4 < 4) {
              *piVar6 = *piVar6 + __ptr->nSize;
              iVar15 = *pDesign + pVVar7->nSize;
              if (pDesign[1] < iVar15) {
                iVar16 = pDesign[1] * 2;
                if (iVar16 <= iVar15) {
                  iVar16 = iVar15;
                }
                pDesign[1] = iVar16;
                pVVar7 = pVVar8;
                pvVar13 = realloc(pbVar4,(long)iVar16);
                *(void **)(pDesign + 2) = pvVar13;
                pVVar8 = pVVar7;
                pvVar13 = realloc(piVar6,(long)(iVar16 << 2));
                *(void **)(pDesign + 4) = pvVar13;
              }
              iVar15 = pVVar7->nSize;
              if (0 < iVar15) {
                iVar16 = *pDesign;
                lVar21 = *(long *)(pDesign + 2);
                lVar5 = *(long *)(pDesign + 4);
                lVar17 = 0;
                do {
                  local_6c = pVVar7->pArray[lVar17];
                  *(undefined1 *)(lVar21 + iVar16 + lVar17) = 5;
                  *(int *)((long)iVar16 * 4 + lVar5 + lVar17 * 4) = local_6c;
                  lVar17 = lVar17 + 1;
                  iVar15 = pVVar7->nSize;
                } while (lVar17 < iVar15);
                *pDesign = iVar16 + (int)lVar17;
              }
              pbVar4 = *(byte **)(pDesign + 2);
              if (pbVar4[2] == 0) goto LAB_0036be99;
              if (pbVar4[2] < 4) {
                piVar6 = *(int **)(pDesign + 4);
                piVar6[2] = piVar6[2] + iVar15;
                if (*pbVar4 == 0) goto LAB_0036be99;
                if (*pbVar4 < 4) {
                  *piVar6 = *piVar6 + pVVar7->nSize;
                  iVar15 = *pDesign + pInputs->nSize;
                  if (pDesign[1] < iVar15) {
                    iVar16 = pDesign[1] * 2;
                    if (iVar16 <= iVar15) {
                      iVar16 = iVar15;
                    }
                    pDesign[1] = iVar16;
                    pvVar13 = realloc(pbVar4,(long)iVar16);
                    *(void **)(pDesign + 2) = pvVar13;
                    pvVar13 = realloc(piVar6,(long)(iVar16 << 2));
                    *(void **)(pDesign + 4) = pvVar13;
                  }
                  if (pInputs->nSize < 1) {
                    iVar16 = 0;
                    iVar15 = local_6c;
                  }
                  else {
                    lVar21 = 0;
                    iVar16 = 0;
                    do {
                      iVar15 = pInputs->pArray[lVar21];
                      pcVar14 = Abc_NamStr(pNames,iVar15);
                      if ((*pcVar14 == 't') && (pcVar14[1] == '_')) {
                        iVar3 = *pDesign;
                        *(undefined1 *)(*(long *)(pDesign + 2) + (long)iVar3) = 10;
                        *pDesign = iVar3 + 1;
                        *(int *)(*(long *)(pDesign + 4) + (long)iVar3 * 4) = iVar15;
                        iVar16 = iVar16 + 1;
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar21 < pInputs->nSize);
                  }
                  pbVar4 = *(byte **)(pDesign + 2);
                  bVar2 = pbVar4[2];
                  local_6c = iVar15;
                  if (bVar2 == 0) goto LAB_0036be99;
                  if (bVar2 < 4) {
                    piVar6 = *(int **)(pDesign + 4);
                    piVar6[2] = piVar6[2] + iVar16;
                    bVar2 = *pbVar4;
                    if (bVar2 == 0) goto LAB_0036be99;
                    if (bVar2 < 4) {
                      *piVar6 = *piVar6 + iVar16;
                      if (0 < __ptr->nSize) {
                        lVar21 = 0;
                        do {
                          local_6c = __ptr->pArray[lVar21];
                          Ndr_AddObject(pDesign,0x102,3,0,0,(int)&local_6c,in_stack_ffffffffffffff88
                                        ,in_stack_ffffffffffffff90,&pInputs->nCap,(int)p_00,
                                        &pVVar10->nCap,(char *)pVVar8);
                          lVar21 = lVar21 + 1;
                        } while (lVar21 < __ptr->nSize);
                      }
                      local_6c = Abc_NamStrFind(pNames,"1\'b0");
                      if (local_6c != 0) {
                        Ndr_AddObject(pDesign,0x102,7,0,0,(int)&local_6c,in_stack_ffffffffffffff88,
                                      in_stack_ffffffffffffff90,&pInputs->nCap,(int)p_00,
                                      &pVVar10->nCap,(char *)pVVar8);
                      }
                      local_6c = Abc_NamStrFind(pNames,"1\'b1");
                      if (local_6c != 0) {
                        Ndr_AddObject(pDesign,0x102,8,0,0,(int)&local_6c,in_stack_ffffffffffffff88,
                                      in_stack_ffffffffffffff90,&pInputs->nCap,(int)p_00,
                                      &pVVar10->nCap,(char *)pVVar8);
                      }
                      iVar16 = pVVar9->nSize;
                      iVar15 = local_6c;
                      if (1 < iVar16) {
                        piVar6 = pVVar9->pArray;
                        lVar21 = 0;
                        do {
                          iVar15 = piVar6[lVar21];
                          iVar3 = (int)lVar21;
                          if (0 < iVar15) {
                            uVar19 = piVar6[lVar21 + 1];
                            if (((int)uVar19 < 0) || (pVVar10->nSize <= (int)uVar19))
                            goto LAB_0036be32;
                            local_3c = pVVar10->pArray[uVar19];
                            if (iVar16 <= iVar3 + 3) goto LAB_0036be32;
                            if (pVVar10->nSize <= (int)(uVar19 + 1)) {
                              local_6c = iVar15;
                              __assert_fail("i >= 0 && i < p->nSize",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                            ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
                            }
                            if (7 < iVar15 - 6U) {
                              local_6c = iVar15;
                              __assert_fail("0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                                            ,0x54,"int Acb_Type2Oper(int)");
                            }
                            Ndr_AddObject(pDesign,0x102,iVar15 + 5,~uVar19 + piVar6[lVar21 + 3],
                                          (int)pVVar10->pArray + (uVar19 + 1) * 4,(int)&local_3c,
                                          in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,
                                          &pInputs->nCap,(int)p_00,&pVVar10->nCap,(char *)pVVar8);
                          }
                          lVar21 = lVar21 + 2;
                        } while (iVar3 + 3 < iVar16);
                      }
                      local_6c = iVar15;
                      if (0 < pVVar8->nSize) {
                        lVar21 = 0;
                        pVVar9 = pVVar8;
                        do {
                          local_6c = pVVar8->pArray[lVar21];
                          Ndr_AddObject(pDesign,0x102,4,1,(int)&local_6c,(int)&local_6c,
                                        in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,
                                        &pInputs->nCap,(int)p_00,&pVVar10->nCap,(char *)pVVar9);
                          lVar21 = lVar21 + 1;
                        } while (lVar21 < pVVar8->nSize);
                      }
                      if (__ptr->pArray != (int *)0x0) {
                        free(__ptr->pArray);
                        __ptr->pArray = (int *)0x0;
                      }
                      free(__ptr);
                      if (pVVar8->pArray != (int *)0x0) {
                        free(pVVar8->pArray);
                        pVVar8->pArray = (int *)0x0;
                      }
                      free(pVVar8);
                      if (pInputs->pArray != (int *)0x0) {
                        free(pInputs->pArray);
                        pInputs->pArray = (int *)0x0;
                      }
                      free(pInputs);
                      if (p_00->pArray != (int *)0x0) {
                        free(p_00->pArray);
                        p_00->pArray = (int *)0x0;
                      }
                      free(p_00);
                      if (pVVar10->pArray != (int *)0x0) {
                        free(pVVar10->pArray);
                        pVVar10->pArray = (int *)0x0;
                      }
                      free(pVVar10);
                      return pDesign;
                    }
                  }
                }
              }
            }
          }
        }
      }
      __assert_fail("Ndr_DataType(p, i) <= NDR_OBJECT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                    ,0x83,"void Ndr_DataAddTo(Ndr_Data_t *, int, int)");
    }
  }
LAB_0036be32:
  local_6c = iVar15;
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void * Acb_VerilogSimpleParse( Vec_Int_t * vBuffer, Abc_Nam_t * pNames )
{
    Ndr_Data_t * pDesign = NULL;
    Vec_Int_t * vInputs  = Vec_IntAlloc(100);
    Vec_Int_t * vOutputs = Vec_IntAlloc(100);
    Vec_Int_t * vWires   = Vec_IntAlloc(100);
    Vec_Int_t * vTypes   = Vec_IntAlloc(100);
    Vec_Int_t * vFanins  = Vec_IntAlloc(100);
    Vec_Int_t * vCur     = NULL;  
    int i, ModuleID, Token, Size, Count = 0;
    assert( Vec_IntEntry(vBuffer, 0) == ACB_MODULE );
    Vec_IntForEachEntryStart( vBuffer, Token, i, 2 )
    {
        if ( vCur == NULL && Token >= ACB_UNUSED )
            continue;
        if ( Token == ACB_ENDMODULE )
            break;
        if ( Token == ACB_INPUT )
            vCur = vInputs;
        else if ( Token == ACB_OUTPUT )
            vCur = vOutputs;
        else if ( Token == ACB_WIRE )
            vCur = vWires;
        else if ( Token >= ACB_BUF && Token <= ACB_XNOR )
        {
            char * pToken = Abc_NamStr(pNames, Vec_IntEntry(vBuffer, i+1));
            Vec_IntPush( vTypes, Token );
            Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
            vCur = vFanins;
            if ( pToken[1] == 'z' && pToken[2] == '_' && pToken[3] == 'g' && pToken[4] == '_' )
                i++;
        }
        else 
            Vec_IntPush( vCur, Token );
    }
    Vec_IntPush( vTypes, -1 );
    Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
    // create design
    pDesign = Ndr_Create( Vec_IntEntry(vBuffer, 1) );
    ModuleID = Ndr_AddModule( pDesign, Vec_IntEntry(vBuffer, 1) );
    // create inputs
    Ndr_DataResize( pDesign, Vec_IntSize(vInputs) );
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_DataPush( pDesign, NDR_INPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vInputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vInputs) );
    // create outputs
    Ndr_DataResize( pDesign, Vec_IntSize(vOutputs) );
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_DataPush( pDesign, NDR_OUTPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vOutputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vOutputs) );
    // create targets
    Ndr_DataResize( pDesign, Vec_IntSize(vWires) );
    Vec_IntForEachEntry( vWires, Token, i )
        if ( Acb_WireIsTarget(Token, pNames) )
            Ndr_DataPush( pDesign, NDR_TARGET, Token ), Count++;
    Ndr_DataAddTo( pDesign, ModuleID-256, Count );
    Ndr_DataAddTo( pDesign, 0, Count );
    // create nodes
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CI, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b0")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_F, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b1")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_T, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    Vec_IntForEachEntryDouble( vTypes, Token, Size, i ) 
        if ( Token > 0 )
        {
            int Output = Vec_IntEntry(vFanins, Size);
            int nFanins = Vec_IntEntry(vTypes, i+3) - Size - 1;
            int * pFanins = Vec_IntEntryP(vFanins, Size+1);
            Ndr_AddObject( pDesign, ModuleID, Acb_Type2Oper(Token), 0, 0, 0, 0, nFanins, pFanins, 1, &Output, NULL ); // many fanins
        }
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CO, 0, 0, 0, 0,   1, &Token, 1, &Token,  NULL  ); // one fanin
    // cleanup
    Vec_IntFree( vInputs );
    Vec_IntFree( vOutputs );
    Vec_IntFree( vWires );
    Vec_IntFree( vTypes );
    Vec_IntFree( vFanins );
    return pDesign;
}